

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void HighsHashHelpers::sparse_combine32(u32 *hash,HighsInt index,u64 value)

{
  uint uVar1;
  u32 uVar2;
  u64 uVar3;
  u64 uVar4;
  undefined8 in_RDX;
  uint in_ESI;
  uint *in_RDI;
  u64 result;
  u64 degree;
  u32 a;
  undefined8 in_stack_ffffffffffffffc0;
  ulong local_30;
  
  uVar3 = pair_hash<0>((u32)in_RDX,(u32)((ulong)in_RDX >> 0x20));
  uVar4 = *(u64 *)(&DAT_008836c0 + (long)(int)(in_ESI & 0x3f) * 8);
  M31();
  uVar1 = *in_RDI;
  modexp_M31((uint)(uVar3 >> 0x21) | 1,uVar4);
  uVar2 = multiply_modM31((u32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (u32)in_stack_ffffffffffffffc0);
  local_30 = (ulong)uVar2 + (ulong)uVar1 >> 0x1f;
  uVar4 = M31();
  local_30 = local_30 + ((ulong)uVar2 + (ulong)uVar1 & uVar4);
  uVar4 = M31();
  if (uVar4 <= local_30) {
    uVar4 = M31();
    local_30 = local_30 - uVar4;
  }
  *in_RDI = (uint)local_30;
  return;
}

Assistant:

static void sparse_combine32(u32& hash, HighsInt index, u64 value) {
    // we take each value of the sparse hash as coefficient for a polynomial
    // of the finite field modulo the mersenne prime 2^61-1 where the monomial
    // for a sparse entry has the degree of its index. We evaluate the
    // polynomial at a random constant. This allows to compute the hashes of
    // sparse vectors independently of each others nonzero contribution and
    // therefore allows to use the order of best access patterns for cache
    // performance. E.g. we can compute a strong hash value for parallel row and
    // column detection and only need to loop over the nonzeros once in
    // arbitrary order. This comes at the expense of more expensive hash
    // calculations as it would be more efficient to evaluate the polynomial
    // with horners scheme, but allows for parallelization and arbitrary order.
    // Since we have 16 random constants available, we slightly improve
    // the scheme by using a lower degree polynomial with 16 variables
    // which we evaluate at the random vector of 16.

    // make sure input value is never zero and at most 31bits are used
    value = (pair_hash<0>(static_cast<u32>(value), value >> 32) >> 33) | 1;

    // make sure that the constant has at most 31 bits, as otherwise the modulo
    // algorithm for multiplication mod M31 might not work properly due to
    // overflow
    u32 a = static_cast<u32>(c[index & 63] & M31());
    u64 degree = (static_cast<u64>(index) >> 6) + 1;

    u64 result = hash;
    result += multiply_modM31(static_cast<u32>(value), modexp_M31(a, degree));
    result = (result >> 31) + (result & M31());
    if (result >= M31()) result -= M31();
    assert(result < M31());
    hash = static_cast<u32>(result);
  }